

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_bitshift(ASMState *as,IRIns *ir,x86Shift xs,x86Op xv)

{
  byte bVar1;
  IRIns *pIVar2;
  MCode *pMVar3;
  uint ref;
  uint uVar4;
  Reg RVar5;
  Reg RVar6;
  Reg rb;
  int iVar7;
  MCode local_4c;
  Reg local_48;
  Reg right_1;
  Reg right;
  Reg left_1;
  Reg left;
  int shift;
  Reg dest;
  IRIns *irr;
  IRRef rref;
  x86Op xv_local;
  x86Shift xs_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  ref = (uint)(ir->field_0).op2;
  pIVar2 = as->ir;
  if (ref < 0x8000) {
    left = ra_dest(as,ir,0xbfef);
    uVar4 = 0x1f;
    if ((0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1) != 0) {
      uVar4 = 0x3f;
    }
    uVar4 = pIVar2[ref].field_1.op12 & uVar4;
    local_4c = (MCode)uVar4;
    if ((((xv == XOg_FADDq) && (uVar4 != 0)) && ((as->flags & 0x40) != 0)) &&
       (RVar5 = asm_fuseloadm(as,(uint)(ir->field_0).op1,0xbfef,
                              0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1), RVar5 != left)) {
      if (xs == XOg_ROL) {
        local_4c = -local_4c;
      }
      pMVar3 = as->mcp;
      as->mcp = pMVar3 + -1;
      pMVar3[-1] = local_4c;
      iVar7 = 0;
      if ((0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1) != 0) {
        iVar7 = 0x800000;
      }
      emit_mrm(as,iVar7 + XV_RORX,left,RVar5);
      return;
    }
    if (uVar4 != 0) {
      if (uVar4 == 1) {
        iVar7 = 0;
        if ((0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1) != 0) {
          iVar7 = 0x80200;
        }
        emit_rr(as,XO_SHIFT1,xs + iVar7,left);
      }
      else {
        pMVar3 = as->mcp;
        as->mcp = pMVar3 + -1;
        pMVar3[-1] = local_4c;
        iVar7 = 0;
        if ((0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1) != 0) {
          iVar7 = 0x80200;
        }
        emit_rr(as,XO_SHIFTi,xs + iVar7,left);
      }
    }
  }
  else {
    if (((as->flags & 0x40) != 0) && (xv != XOg_FADDq)) {
      RVar5 = ra_dest(as,ir,0xbfef);
      RVar6 = ra_alloc1(as,ref,0xbfef);
      rb = asm_fuseloadm(as,(uint)(ir->field_0).op1,
                         (1 << ((byte)RVar6 & 0x1f) ^ 0xffffffffU) & 0xbfef,
                         0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1);
      iVar7 = 0;
      if ((0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1) != 0) {
        iVar7 = 0x800000;
      }
      emit_mrm(as,xv + iVar7 ^ RVar6 << 0x13,RVar5,rb);
      return;
    }
    left = ra_dest(as,ir,0xbfed);
    if (left == 1) {
      left = ra_scratch(as,0xbfed);
      iVar7 = 0;
      if ((0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1) != 0) {
        iVar7 = 0x80200;
      }
      emit_rr(as,XO_MOV,iVar7 + 1,left);
    }
    bVar1 = pIVar2[ref].field_1.r;
    local_48 = (Reg)bVar1;
    if ((bVar1 & 0x80) == 0) {
      if (local_48 != 1) {
        ra_scratch(as,2);
      }
    }
    else {
      local_48 = ra_allocref(as,ref,2);
    }
    iVar7 = 0;
    if ((0x605fd9U >> ((ir->field_1).t.irt & 0x1f) & 1) != 0) {
      iVar7 = 0x80200;
    }
    emit_rr(as,XO_SHIFTcl,xs + iVar7,left);
    as->weakset = (1 << ((byte)local_48 & 0x1f) ^ 0xffffffffU) & as->weakset;
    if (local_48 != 1) {
      emit_rr(as,XO_MOV,1,local_48);
    }
  }
  ra_left(as,left,(uint)(ir->field_0).op1);
  return;
}

Assistant:

static void asm_bitshift(ASMState *as, IRIns *ir, x86Shift xs, x86Op xv)
{
  IRRef rref = ir->op2;
  IRIns *irr = IR(rref);
  Reg dest;
  if (irref_isk(rref)) {  /* Constant shifts. */
    int shift;
    dest = ra_dest(as, ir, RSET_GPR);
    shift = irr->i & (irt_is64(ir->t) ? 63 : 31);
    if (!xv && shift && (as->flags & JIT_F_BMI2)) {
      Reg left = asm_fuseloadm(as, ir->op1, RSET_GPR, irt_is64(ir->t));
      if (left != dest) {  /* BMI2 rotate right by constant. */
	emit_i8(as, xs == XOg_ROL ? -shift : shift);
	emit_mrm(as, VEX_64IR(ir, XV_RORX), dest, left);
	return;
      }
    }
    switch (shift) {
    case 0: break;
    case 1: emit_rr(as, XO_SHIFT1, REX_64IR(ir, xs), dest); break;
    default: emit_shifti(as, REX_64IR(ir, xs), dest, shift); break;
    }
  } else if ((as->flags & JIT_F_BMI2) && xv) {	/* BMI2 variable shifts. */
    Reg left, right;
    dest = ra_dest(as, ir, RSET_GPR);
    right = ra_alloc1(as, rref, RSET_GPR);
    left = asm_fuseloadm(as, ir->op1, rset_exclude(RSET_GPR, right),
			 irt_is64(ir->t));
    emit_mrm(as, VEX_64IR(ir, xv) ^ (right << 19), dest, left);
    return;
  } else {  /* Variable shifts implicitly use register cl (i.e. ecx). */
    Reg right;
    dest = ra_dest(as, ir, rset_exclude(RSET_GPR, RID_ECX));
    if (dest == RID_ECX) {
      dest = ra_scratch(as, rset_exclude(RSET_GPR, RID_ECX));
      emit_rr(as, XO_MOV, REX_64IR(ir, RID_ECX), dest);
    }
    right = irr->r;
    if (ra_noreg(right))
      right = ra_allocref(as, rref, RID2RSET(RID_ECX));
    else if (right != RID_ECX)
      ra_scratch(as, RID2RSET(RID_ECX));
    emit_rr(as, XO_SHIFTcl, REX_64IR(ir, xs), dest);
    ra_noweak(as, right);
    if (right != RID_ECX)
      emit_rr(as, XO_MOV, RID_ECX, right);
  }
  ra_left(as, dest, ir->op1);
  /*
  ** Note: avoid using the flags resulting from a shift or rotate!
  ** All of them cause a partial flag stall, except for r,1 shifts
  ** (but not rotates). And a shift count of 0 leaves the flags unmodified.
  */
}